

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_value_numeric_type(sqlite3_value *pVal)

{
  int iVar1;
  sqlite3_value *in_RDI;
  Mem *pMem;
  int eType;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = sqlite3_value_type(in_RDI);
  if (iVar1 == 3) {
    applyNumericAffinity((Mem *)CONCAT44(3,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
    iVar1 = sqlite3_value_type(in_RDI);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_value_numeric_type(sqlite3_value *pVal){
  int eType = sqlite3_value_type(pVal);
  if( eType==SQLITE_TEXT ){
    Mem *pMem = (Mem*)pVal;
    applyNumericAffinity(pMem, 0);
    eType = sqlite3_value_type(pVal);
  }
  return eType;
}